

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::tfdt::tfdt(tfdt *this)

{
  allocator<char> local_31;
  string local_30 [32];
  tfdt *local_10;
  tfdt *this_local;
  
  local_10 = this;
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00139c38;
  this->base_media_decode_time_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"tfdt",&local_31);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

tfdt() : full_box() , base_media_decode_time_(0){ box_type_ = std::string("tfdt"); }